

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMInstPrinter.c
# Opt level: O0

void printThumbSRImm(MCInst *MI,uint OpNum,SStream *O)

{
  uint8_t *puVar1;
  cs_detail *pcVar2;
  uint32_t uVar3;
  MCOperand *op;
  int64_t iVar4;
  uint in_ESI;
  MCInst *in_RDI;
  uint tmp;
  uint Imm;
  uint32_t val;
  
  op = MCInst_getOperand(in_RDI,in_ESI);
  iVar4 = MCOperand_getImm(op);
  uVar3 = (uint32_t)iVar4;
  val = uVar3;
  if (uVar3 == 0) {
    val = 0x20;
  }
  printUInt32Bang((SStream *)CONCAT44(uVar3,val),val);
  if (in_RDI->csh->detail != CS_OPT_OFF) {
    puVar1 = in_RDI->flat_insn->detail->groups +
             (ulong)(in_RDI->flat_insn->detail->field_6).arm.op_count * 0x30 + 0x41;
    puVar1[0] = '\x02';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    *(uint32_t *)
     (in_RDI->flat_insn->detail->groups +
     (ulong)(in_RDI->flat_insn->detail->field_6).arm.op_count * 0x30 + 0x45) = val;
    pcVar2 = in_RDI->flat_insn->detail;
    (pcVar2->field_6).arm.op_count = (pcVar2->field_6).arm.op_count + '\x01';
  }
  return;
}

Assistant:

static void printThumbSRImm(MCInst *MI, unsigned OpNum, SStream *O)
{
	unsigned Imm = (unsigned int)MCOperand_getImm(MCInst_getOperand(MI, OpNum));
	unsigned tmp = Imm == 0 ? 32 : Imm;

	printUInt32Bang(O, tmp);

	if (MI->csh->detail) {
		MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].type = ARM_OP_IMM;
		MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].imm = tmp;
		MI->flat_insn->detail->arm.op_count++;
	}
}